

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::CopyFrom
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,
          TPZMatrix<long_double> *mat)

{
  TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this_00;
  long in_RSI;
  TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *from;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 0) {
    this_00 = (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)0x0;
  }
  else {
    this_00 = (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)
              __dynamic_cast(in_RSI,&TPZMatrix<long_double>::typeinfo,
                             &TPZDohrPrecond<long_double,TPZDohrSubstruct<long_double>>::typeinfo,0)
    ;
  }
  if (this_00 == (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZDohrPrecond<long double, TPZDohrSubstruct<long double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = long double, TSubStruct = TPZDohrSubstruct<long double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
    std::operator<<((ostream *)&std::cerr,"Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  else {
    operator=(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }